

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall
CTxIn::CTxIn(CTxIn *this,Txid hashPrevTx,uint32_t nOut,CScript *scriptSigIn,uint32_t nSequenceIn)

{
  long lVar1;
  undefined4 in_ECX;
  COutPoint *in_RDX;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  Txid *in_stack_ffffffffffffff70;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  COutPoint::COutPoint((COutPoint *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  CScript::CScript((CScript *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  CScriptWitness::CScriptWitness
            ((CScriptWitness *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  COutPoint::COutPoint(in_RDX,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(undefined4 *)(in_RDI + 4) = local_c;
  in_RDI[2] = local_1c;
  in_RDI[3] = uStack_14;
  *in_RDI = local_2c;
  in_RDI[1] = uStack_24;
  CScript::operator=((CScript *)in_RDX,(CScript *)in_stack_ffffffffffffff70);
  *(undefined4 *)(in_RDI + 9) = in_ECX;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTxIn::CTxIn(Txid hashPrevTx, uint32_t nOut, CScript scriptSigIn, uint32_t nSequenceIn)
{
    prevout = COutPoint(hashPrevTx, nOut);
    scriptSig = scriptSigIn;
    nSequence = nSequenceIn;
}